

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Quake(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  VMValue *pVVar3;
  VMValue *pVVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar8;
  AActor *activator;
  bool bVar9;
  int local_2c;
  PClass *pPVar7;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003dc36f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dc35f:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dc36f:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1428,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003dc2b7;
    pPVar7 = (activator->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar6 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
      (activator->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar9 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar5 && bVar9) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar5) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dc36f;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003dc35f;
LAB_003dc2b7:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      if (numparam < 3) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
          if (numparam == 3) {
            pcVar8 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              if ((uint)numparam < 5) {
                pcVar8 = "(paramnum) < numparam";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
                  pVVar1 = param + 1;
                  pVVar2 = param + 2;
                  pVVar3 = param + 3;
                  pVVar4 = param + 4;
                  if (numparam == 5) {
                    param = defaultparam->Array;
                    if (param[5].field_0.field_3.Type == '\0') {
LAB_003dc338:
                      local_2c = param[5].field_0.i;
                      P_StartQuake(activator,0,(pVVar1->field_0).i,(pVVar2->field_0).i,
                                   (pVVar3->field_0).i,(pVVar4->field_0).i,(FSoundID)(int)&local_2c)
                      ;
                      return 0;
                    }
                    pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
                  }
                  else {
                    if (param[5].field_0.field_3.Type == '\0') goto LAB_003dc338;
                    pcVar8 = "(param[paramnum]).Type == REGT_INT";
                  }
                  __assert_fail(pcVar8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x142d,
                                "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar8 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x142c,
                            "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar8 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x142b,
                        "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        pcVar8 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x142a,
                    "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar8 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1429,"int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Quake)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(intensity);
	PARAM_INT		(duration);
	PARAM_INT		(damrad);
	PARAM_INT		(tremrad);
	PARAM_SOUND_DEF	(sound);

	P_StartQuake(self, 0, intensity, duration, damrad, tremrad, sound);
	return 0;
}